

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O3

int ep_server_start_loop(char *port,void *userdata)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  char *pcVar5;
  epoll_event event;
  addrinfo *local_50;
  undefined1 local_48 [16];
  undefined8 uStack_38;
  sockaddr *local_30;
  char *pcStack_28;
  addrinfo *local_20;
  
  BUF_SIZE = getpagesize();
  uStack_38._0_4_ = 0;
  uStack_38._4_4_ = 0;
  local_30 = (sockaddr *)0x0;
  pcStack_28 = (char *)0x0;
  local_20 = (addrinfo *)0x0;
  local_48._8_8_ = 1;
  local_48._0_4_ = 1;
  local_48._4_4_ = 2;
  iVar1 = getaddrinfo((char *)0x0,port,(addrinfo *)local_48,&local_50);
  if (iVar1 == -1) {
    pcVar5 = "\x1b[31mERROR: %s: %s: %d: can not get socket descriptor!\x1b[m\n";
    uVar4 = 0x24;
  }
  else {
    iVar1 = socket(local_50->ai_family,local_50->ai_socktype,local_50->ai_protocol);
    if (iVar1 == -1) {
      pcVar5 = "\x1b[31mERROR: %s: %s: %d: can not get socket descriptor!\x1b[m\n";
      uVar4 = 0x2b;
    }
    else {
      iVar2 = bind(iVar1,local_50->ai_addr,local_50->ai_addrlen);
      if (iVar2 != -1) {
        freeaddrinfo(local_50);
        iVar2 = make_socket_non_block(iVar1);
        if (iVar2 == -1) {
          pcVar5 = "\x1b[31mERROR: %s: %s: %d: connot set flags!\x1b[m\n";
          uVar4 = 0xaa;
        }
        else {
          iVar2 = listen(iVar1,0x1000);
          if (iVar2 == -1) {
            pcVar5 = "\x1b[31mERROR: %s: %s: %d: cannot listen!\x1b[m\n";
            uVar4 = 0xb1;
          }
          else {
            iVar2 = epoll_create(1);
            if (iVar2 == -1) {
              pcVar5 = "\x1b[31mERROR: %s: %s: %d: cannot create epoll!\x1b[m\n";
              uVar4 = 0xb8;
            }
            else {
              local_48._4_4_ = iVar1;
              local_48._0_4_ = -0x7ffffffb;
              iVar3 = epoll_ctl(iVar2,1,iVar1,(epoll_event *)local_48);
              if (iVar3 != -1) {
                sk_on_start(iVar2,userdata);
                do {
                  loop_once(iVar2,iVar1,(epoll_event *)local_48);
                } while( true );
              }
              pcVar5 = "\x1b[31mERROR: %s: %s: %d: can not add event to epoll!\x1b[m\n";
              uVar4 = 0xc1;
            }
          }
        }
        goto LAB_00106428;
      }
      pcVar5 = "\x1b[31mERROR: %s: %s: %d: bind error!\x1b[m\n";
      uVar4 = 0x32;
    }
  }
  printf(pcVar5,"epoll.cpp","create_and_bind",uVar4);
  sk_on_global_error();
  pcVar5 = "\x1b[31mERROR: %s: %s: %d: cannot create socket!\x1b[m\n";
  uVar4 = 0xa3;
LAB_00106428:
  printf(pcVar5,"epoll.cpp","ep_server_start_loop",uVar4);
  sk_on_global_error();
  return -1;
}

Assistant:

int ep_server_start_loop(const char *port, void *userdata)
{
    init_settings();

    int sfd, res, epoll;
    struct epoll_event event;

    sfd = create_and_bind(port);
    if (sfd == -1) {
        LOGE("cannot create socket!");
        sk_on_global_error();
        return -1;
    }

    res = make_socket_non_block(sfd);
    if (res == -1) {
        LOGE("connot set flags!");
        sk_on_global_error();
        return -1;
    }

    res = listen(sfd, SOMAXCONN);
    if (res == -1) {
        LOGE("cannot listen!");
        sk_on_global_error();
        return -1;
    }

    epoll = epoll_create(1);
    if (epoll == -1) {
        LOGE("cannot create epoll!");
        sk_on_global_error();
        return -1;
    }

    event.events  = EPOLLIN | EPOLLOUT | EPOLLET;
    event.data.fd = sfd;
    res = epoll_ctl(epoll, EPOLL_CTL_ADD, sfd, &event);
    if (res == -1) {
        LOGE("can not add event to epoll!");
        sk_on_global_error();
        return -1;
    }

    sk_on_start(epoll, userdata);

    for (;;) {
        loop_once(epoll, sfd, event);
    }

    close(epoll);
    sk_on_close(epoll);

    return 0;
}